

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

void __thiscall
boost::shared_ptr<boost::basic_wrap_stringstream<char>>::
shared_ptr<boost::basic_wrap_stringstream<char>>
          (shared_ptr<boost::basic_wrap_stringstream<char>_> *this,basic_wrap_stringstream<char> *p)

{
  sp_counted_base *in_RSI;
  shared_count *in_RDI;
  basic_wrap_stringstream<char> *p_00;
  shared_ptr<boost::basic_wrap_stringstream<char>_> *in_stack_ffffffffffffffe0;
  
  in_RDI->pi_ = in_RSI;
  p_00 = (basic_wrap_stringstream<char> *)(in_RDI + 1);
  detail::shared_count::shared_count((shared_count *)p_00);
  detail::
  sp_pointer_construct<boost::basic_wrap_stringstream<char>,boost::basic_wrap_stringstream<char>>
            (in_stack_ffffffffffffffe0,p_00,in_RDI);
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }